

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestRunTest.cxx
# Opt level: O3

void __thiscall cmCTestRunTest::ComputeWeightedCost(cmCTestRunTest *this)

{
  cmCTestTestProperties *pcVar1;
  double dVar2;
  
  if ((this->TestResult).Status == 9) {
    pcVar1 = this->TestProperties;
    dVar2 = (double)pcVar1->PreviousRuns;
    pcVar1->Cost = (float)(((double)pcVar1->Cost * dVar2 + (this->TestResult).ExecutionTime.__r) /
                          (dVar2 + 1.0));
    pcVar1->PreviousRuns = pcVar1->PreviousRuns + 1;
  }
  return;
}

Assistant:

void cmCTestRunTest::ComputeWeightedCost()
{
  double prev = static_cast<double>(this->TestProperties->PreviousRuns);
  double avgcost = static_cast<double>(this->TestProperties->Cost);
  double current = this->TestResult.ExecutionTime.count();

  if (this->TestResult.Status == cmCTestTestHandler::COMPLETED) {
    this->TestProperties->Cost =
      static_cast<float>(((prev * avgcost) + current) / (prev + 1.0));
    this->TestProperties->PreviousRuns++;
  }
}